

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

StrWriter * __thiscall
moira::StrWriter::operator<<(StrWriter *this,IxMot<(moira::Mode)6,_1> wrapper)

{
  uint uVar1;
  char *pcVar2;
  An an;
  u16 size;
  u16 is;
  u16 bs;
  u16 scale;
  u16 lw;
  u16 reg;
  anon_class_16_2_f84c6168 outerDisplacement;
  u32 outer;
  u32 base;
  anon_class_24_3_19472836 baseRegister;
  anon_class_24_3_79b1865b baseDisplacement;
  anon_class_40_5_76b1e68d indexRegister;
  ushort local_ac;
  ushort local_aa;
  ushort local_a8;
  ushort local_a6;
  ushort local_a4;
  u16 local_a2;
  anon_class_16_2_f84c6168 local_a0;
  u32 local_90;
  u32 local_8c;
  anon_class_24_3_19472836 local_88;
  anon_class_24_3_79b1865b local_70;
  anon_class_40_5_76b1e68d local_58;
  
  uVar1 = (wrapper.ea)->ext1;
  if ((uVar1 >> 8 & 1) == 0) {
    operator<<(this,"(");
    operator<<(this,(Int)(int)(char)uVar1);
    operator<<(this,",");
    an.raw._2_2_ = 0;
    an.raw._0_2_ = (wrapper.ea)->reg;
    operator<<(this,an);
    operator<<(this,",");
    operator<<(this,(Rn)(uVar1 >> 0xc & 0xf));
    pcVar2 = "$%x.l";
    if ((uVar1 >> 0xb & 1) == 0) {
      pcVar2 = "$%x.w";
    }
    operator<<(this,pcVar2 + 3);
    operator<<(this,(Scale)(uVar1 >> 9 & 3));
  }
  else {
    local_58.reg = &local_a2;
    local_a2 = (u16)((uVar1 & 0xffff) >> 0xc);
    local_a4 = (ushort)(uVar1 >> 0xb) & 1;
    local_58.lw = &local_a4;
    local_a6 = (ushort)(uVar1 >> 9) & 3;
    local_58.scale = &local_a6;
    local_a8 = (ushort)(uVar1 >> 7) & 1;
    local_88.bs = &local_a8;
    local_aa = (ushort)(uVar1 >> 6) & 1;
    local_58.is = &local_aa;
    local_ac = (ushort)(uVar1 >> 4) & 3;
    local_70.size = &local_ac;
    local_8c = (wrapper.ea)->ext2;
    local_70.base = &local_8c;
    local_90 = (wrapper.ea)->ext3;
    local_a0.outer = &local_90;
    local_a0.this = this;
    local_88.this = this;
    local_88.ea = wrapper.ea;
    local_70.this = this;
    local_58.this = this;
    if ((uVar1 & 7) == 0) {
      operator<<(this,"(");
      operator<<<(moira::Mode)6,_1>::anon_class_24_3_79b1865b::operator()(&local_70);
      operator<<<(moira::Mode)6,_1>::anon_class_24_3_19472836::operator()(&local_88);
      operator<<<(moira::Mode)6,_1>::anon_class_40_5_76b1e68d::operator()(&local_58);
    }
    else {
      operator<<(this,"([");
      operator<<<(moira::Mode)6,_1>::anon_class_24_3_79b1865b::operator()(&local_70);
      operator<<<(moira::Mode)6,_1>::anon_class_24_3_19472836::operator()(&local_88);
      if ((uVar1 & 4) == 0) {
        operator<<<(moira::Mode)6,_1>::anon_class_40_5_76b1e68d::operator()(&local_58);
        operator<<(this,"]");
      }
      else {
        operator<<(this,"]");
        operator<<<(moira::Mode)6,_1>::anon_class_40_5_76b1e68d::operator()(&local_58);
      }
      operator<<<(moira::Mode)6,_1>::anon_class_16_2_f84c6168::operator()(&local_a0);
    }
  }
  operator<<(this,")");
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(IxMot<M, S> wrapper)
{
    assert(M == Mode(6) || M == Mode(10));

    auto &ea = wrapper.ea;

    u16 full = _______x________ (ea.ext1);

    if (!full) {

        //   15-12   11   10   09   08   07   06   05   04   03   02   01   00
        // --------------------------------------------------------------------
        // | REG   | LW | SCALE   | 0  | DISPLACEMENT                         |
        // --------------------------------------------------------------------

        u16 reg   = xxxx____________ (ea.ext1);
        u16 lw    = ____x___________ (ea.ext1);
        u16 scale = _____xx_________ (ea.ext1);
        u16 disp  = ________xxxxxxxx (ea.ext1);

        *this << "(" << Int{(i8)disp} << ",";
        M == Mode(10) ? *this << Pc{} : *this << An{ea.reg};
        *this << "," << Rn{reg} << (lw ? ".l" : ".w") << Scale{scale} << ")";

    } else {

        //   15-12   11   10   09   08   07   06   05   04   03   02   01   00
        // --------------------------------------------------------------------
        // | REG   | LW | SCALE   | 1  | BS | IS | BD SIZE  | 0  | IIS        |
        // --------------------------------------------------------------------

        u16  reg   = xxxx____________ (ea.ext1);
        u16  lw    = ____x___________ (ea.ext1);
        u16  scale = _____xx_________ (ea.ext1);
        u16  bs    = ________x_______ (ea.ext1);
        u16  is    = _________x______ (ea.ext1);
        u16  size  = __________xx____ (ea.ext1);
        u16  iis   = _____________xxx (ea.ext1);
        u32  base  = ea.ext2;
        u32  outer = ea.ext3;

        auto baseDisplacement = [&]() {
            size == 3 ? (*this << Int{(i32)base}) : (*this << Int{(i16)base});
        };
        auto baseRegister = [&]() {
            if constexpr (M == Mode(10)) {
                if (!bs) { *this << Sep{} << Pc{}; } else { *this << Sep{} << Zpc{}; }
            } else {
                if (!bs) { *this << Sep{} << An{ea.reg}; }
            }
        };
        auto indexRegister = [&]() {
            if (!is) *this << Sep{} << Rn{reg} << (lw ? ".l" : ".w") << Scale{scale};
        };
        auto outerDisplacement = [&]() {
            *this << Sep{} << Int(outer);
        };

        if (iis == 0) {

            // Memory Indirect Unindexed
            *this << "(";
            baseDisplacement(); baseRegister(); indexRegister();
            *this << ")";

        } else if (iis & 0b100) {

            // Memory Indirect Postindexed
            *this << "([";
            baseDisplacement(); baseRegister();
            *this << "]";
            indexRegister(); outerDisplacement();
            *this << ")";

        } else {

            // Memory Indirect Preindexed
            *this << "([";
            baseDisplacement(); baseRegister(); indexRegister();
            *this << "]";
            outerDisplacement();
            *this << ")";
        }
    }

    return *this;
}